

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

void sqlcheck::CheckMultiValuedAttribute
               (Configuration *state,string *sql_statement,bool *print_statement)

{
  allocator local_a9;
  string title;
  regex pattern;
  string local_68;
  string local_48;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&pattern,"(id\\s+varchar)|(id\\s+text)|(id\\s+regexp)",0x10);
  std::__cxx11::string::string((string *)&title,"Multi-Valued Attribute",&local_a9);
  std::__cxx11::string::string((string *)&local_48,(string *)&title);
  std::__cxx11::string::string((string *)&local_68,anon_var_dwarf_a9427,&local_a9);
  CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_HIGH,
               PATTERN_TYPE_LOGICAL_DATABASE_DESIGN,&local_48,&local_68,true,0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&title);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  return;
}

Assistant:

void CheckMultiValuedAttribute(Configuration& state,
                               const std::string& sql_statement,
                               bool& print_statement){

  std::regex pattern("(id\\s+varchar)|(id\\s+text)|(id\\s+regexp)");
  std::string title = "Multi-Valued Attribute";
  PatternType pattern_type = PatternType::PATTERN_TYPE_LOGICAL_DATABASE_DESIGN;

  auto message =
      "● Store each value in its own column and row:  "
      "Storing a list of IDs as a VARCHAR/TEXT column can cause performance and data integrity "
      "problems. Querying against such a column would require using pattern-matching "
      "expressions. It is awkward and costly to join a comma-separated list to matching rows. "
      "This will make it harder to validate IDs. Think about what is the greatest number of "
      "entries this list must support? Instead of using a multi-valued attribute, "
      "consider storing it in a separate table, so that each individual value of that attribute "
      "occupies a separate row. Such an intersection table implements a many-to-many relationship "
      "between the two referenced tables. This will greatly simplify querying and validating "
      "the IDs.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_HIGH,
               pattern_type,
               title,
               message,
               true);

}